

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O1

char * add_modifier_key(char *p,char *end,char *name)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = strlen(end);
  pcVar2 = p + (int)sVar1;
  if (pcVar2 < fl_shortcut_label::buf + 0x3d) {
    strcpy(p,end);
  }
  else {
    if (fl_shortcut_label::buf + 0x3c < p + 4) {
      return p;
    }
    builtin_strncpy(p,"...",4);
    pcVar2 = p + 3;
  }
  if (pcVar2[-1] != '+') {
    if (pcVar2[-1] == '\\') {
      pcVar2 = pcVar2 + -1;
    }
    else {
      *pcVar2 = '+';
      pcVar2 = pcVar2 + 1;
    }
  }
  return pcVar2;
}

Assistant:

static char *add_modifier_key(char *p, const char *end, const char *name) {
  int ln = strlen(name);
  if (p+ln > end) {		// string too long
    if (p+4 <= end) {		// can replace with "..." ?
      strcpy(p,"...");
      p += 3;
    } else
      return p;
  } else {
    strcpy(p,name);
    p += ln;
  }
  if (p[-1] == '\\')		// remove (last) '\' character
    p--;
  else if (p[-1] == '+')	// don't add another '+' character
    {/*empty*/}
  else				// not a '\' or '+'
    *p++ = '+';			// add a '+' character
  return p;
}